

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_stb_image.cpp
# Opt level: O1

stbi_uc * crnlib::stbi_tga_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi_uc *psVar1;
  stbi local_50;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    psVar1 = (stbi_uc *)0x0;
  }
  else {
    local_50.img_file = (FILE *)__stream;
    psVar1 = tga_load(&local_50,x,y,comp,req_comp);
    fclose(__stream);
  }
  return psVar1;
}

Assistant:

stbi_uc* stbi_tga_load(char const* filename, int* x, int* y, int* comp, int req_comp) {
  stbi_uc* data;
  FILE* f = fopen(filename, "rb");
  if (!f)
    return NULL;
  data = stbi_tga_load_from_file(f, x, y, comp, req_comp);
  fclose(f);
  return data;
}